

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::EnhancedLayouts::FragmentDataLocationAPITest::checkResults
          (FragmentDataLocationAPITest *this,GLuint param_1,Texture *param_2)

{
  reference pvVar1;
  TestContext *pTVar2;
  TestLog *pTVar3;
  MessageBuilder *pMVar4;
  MessageBuilder local_678;
  value_type local_4f8;
  uint local_4f4;
  GLuint color_3;
  GLuint i_3;
  value_type local_370;
  uint local_36c;
  GLuint color_2;
  GLuint i_2;
  value_type local_1e4;
  uint local_1e0;
  GLuint color_1;
  GLuint i_1;
  value_type local_54;
  uint local_50;
  GLuint color;
  GLuint i;
  undefined1 local_40 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> data;
  Texture *param_7_local;
  GLuint param_6_local;
  FragmentDataLocationAPITest *this_local;
  
  data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = &param_2->m_id;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,0x100);
  pvVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,0);
  Utils::Texture::Get(&this->m_goku,0x1908,0x1401,pvVar1);
  for (local_50 = 0; local_50 < 0x100; local_50 = local_50 + 1) {
    pvVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,
                        (ulong)local_50);
    local_54 = *pvVar1;
    if (local_54 != 0xff000000) {
      pTVar2 = deqp::Context::getTestContext
                         ((this->super_TextureTestBase).super_TestBase.super_TestCase.m_context);
      pTVar3 = tcu::TestContext::getLog(pTVar2);
      tcu::TestLog::operator<<
                ((MessageBuilder *)&i_1,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar4 = tcu::MessageBuilder::operator<<((MessageBuilder *)&i_1,(char (*) [7])"RGBA8[");
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_50);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x29f402d);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_54);
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&i_1);
      this_local._7_1_ = false;
      goto LAB_00e87534;
    }
  }
  pvVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,0);
  Utils::Texture::Get(&this->m_gohan,0x1908,0x1401,pvVar1);
  for (local_1e0 = 0; local_1e0 < 0x100; local_1e0 = local_1e0 + 1) {
    pvVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,
                        (ulong)local_1e0);
    local_1e4 = *pvVar1;
    if (local_1e4 != 0xff0000ff) {
      pTVar2 = deqp::Context::getTestContext
                         ((this->super_TextureTestBase).super_TestBase.super_TestCase.m_context);
      pTVar3 = tcu::TestContext::getLog(pTVar2);
      tcu::TestLog::operator<<
                ((MessageBuilder *)&color_2,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar4 = tcu::MessageBuilder::operator<<((MessageBuilder *)&color_2,(char (*) [7])"RGBA8[");
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_1e0);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x29f402d);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_1e4);
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&color_2);
      this_local._7_1_ = false;
      goto LAB_00e87534;
    }
  }
  pvVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,0);
  Utils::Texture::Get(&this->m_goten,0x1908,0x1401,pvVar1);
  for (local_36c = 0; local_36c < 0x100; local_36c = local_36c + 1) {
    pvVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,
                        (ulong)local_36c);
    local_370 = *pvVar1;
    if (local_370 != 0xff00ff00) {
      pTVar2 = deqp::Context::getTestContext
                         ((this->super_TextureTestBase).super_TestBase.super_TestCase.m_context);
      pTVar3 = tcu::TestContext::getLog(pTVar2);
      tcu::TestLog::operator<<
                ((MessageBuilder *)&color_3,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar4 = tcu::MessageBuilder::operator<<((MessageBuilder *)&color_3,(char (*) [7])"RGBA8[");
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_36c);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x29f402d);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_370);
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&color_3);
      this_local._7_1_ = false;
      goto LAB_00e87534;
    }
  }
  pvVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,0);
  Utils::Texture::Get(&this->m_chichi,0x1908,0x1401,pvVar1);
  local_4f4 = 0;
  do {
    if (0xff < local_4f4) {
      this_local._7_1_ = true;
LAB_00e87534:
      color_1 = 1;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40);
      return this_local._7_1_;
    }
    pvVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,
                        (ulong)local_4f4);
    local_4f8 = *pvVar1;
    if (local_4f8 != 0xffff0000) {
      pTVar2 = deqp::Context::getTestContext
                         ((this->super_TextureTestBase).super_TestBase.super_TestCase.m_context);
      pTVar3 = tcu::TestContext::getLog(pTVar2);
      tcu::TestLog::operator<<(&local_678,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar4 = tcu::MessageBuilder::operator<<(&local_678,(char (*) [7])"RGBA8[");
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_4f4);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x29f402d);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_4f8);
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_678);
      this_local._7_1_ = false;
      goto LAB_00e87534;
    }
    local_4f4 = local_4f4 + 1;
  } while( true );
}

Assistant:

bool FragmentDataLocationAPITest::checkResults(glw::GLuint /* test_case_index */, Utils::Texture& /* color_0 */)
{
	static const GLuint size			= m_width * m_height;
	static const GLuint expected_goku   = 0xff000000;
	static const GLuint expected_gohan  = 0xff0000ff;
	static const GLuint expected_goten  = 0xff00ff00;
	static const GLuint expected_chichi = 0xffff0000;

	std::vector<GLuint> data;
	data.resize(size);

	m_goku.Get(GL_RGBA, GL_UNSIGNED_BYTE, &data[0]);

	for (GLuint i = 0; i < size; ++i)
	{
		const GLuint color = data[i];

		if (expected_goku != color)
		{
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "RGBA8[" << i << "]:" << color
												<< tcu::TestLog::EndMessage;
			return false;
		}
	}

	m_gohan.Get(GL_RGBA, GL_UNSIGNED_BYTE, &data[0]);

	for (GLuint i = 0; i < size; ++i)
	{
		const GLuint color = data[i];

		if (expected_gohan != color)
		{
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "RGBA8[" << i << "]:" << color
												<< tcu::TestLog::EndMessage;
			return false;
		}
	}

	m_goten.Get(GL_RGBA, GL_UNSIGNED_BYTE, &data[0]);

	for (GLuint i = 0; i < size; ++i)
	{
		const GLuint color = data[i];

		if (expected_goten != color)
		{
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "RGBA8[" << i << "]:" << color
												<< tcu::TestLog::EndMessage;
			return false;
		}
	}

	m_chichi.Get(GL_RGBA, GL_UNSIGNED_BYTE, &data[0]);

	for (GLuint i = 0; i < size; ++i)
	{
		const GLuint color = data[i];

		if (expected_chichi != color)
		{
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "RGBA8[" << i << "]:" << color
												<< tcu::TestLog::EndMessage;
			return false;
		}
	}

	return true;
}